

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::MultiNodeChain<QCss::StyleRule>::free
          (MultiNodeChain<QCss::StyleRule> *this,void *__ptr)

{
  MultiNodeChain<QCss::StyleRule> *pMVar1;
  MultiNodeChain<QCss::StyleRule> *n;
  MultiNodeChain<QCss::StyleRule> *e;
  qsizetype nEntries;
  MultiNodeChain<QCss::StyleRule> *local_18;
  
  pMVar1 = this;
  while (local_18 = pMVar1, local_18 != (MultiNodeChain<QCss::StyleRule> *)0x0) {
    pMVar1 = local_18->next;
    if (local_18 != (MultiNodeChain<QCss::StyleRule> *)0x0) {
      ~MultiNodeChain((MultiNodeChain<QCss::StyleRule> *)0x45c83c);
      operator_delete(local_18,0x40);
    }
  }
  return;
}

Assistant:

qsizetype free() noexcept(std::is_nothrow_destructible_v<T>)
    {
        qsizetype nEntries = 0;
        MultiNodeChain *e = this;
        while (e) {
            MultiNodeChain *n = e->next;
            ++nEntries;
            delete e;
            e = n;
        }
        return  nEntries;
    }